

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceMemoryVkImpl::DeviceMemoryVkImpl
          (DeviceMemoryVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDeviceVk,
          DeviceMemoryCreateInfo *MemCI)

{
  RenderDeviceVkImpl *pRVar1;
  VulkanPhysicalDevice *this_00;
  VulkanLogicalDevice *this_01;
  IDeviceObject *pIVar2;
  ulong uVar3;
  TextureVkImpl *pTVar4;
  BufferVkImpl *this_02;
  VkBuffer vkBuffer;
  ulong __n;
  uint32_t memoryTypeBitsRequirement;
  ulong uVar5;
  uint local_84;
  RefCntAutoPtr<Diligent::IBufferVk> pBuffer;
  string msg;
  RefCntAutoPtr<Diligent::ITextureVk> pTexture;
  
  DeviceMemoryBase<Diligent::EngineVkImplTraits>::DeviceMemoryBase
            (&this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>,pRefCounters,pDeviceVk,
             MemCI);
  (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
  .super_ObjectBase<Diligent::IDeviceMemoryVk>.super_RefCountedObject<Diligent::IDeviceMemoryVk>.
  super_IDeviceMemoryVk.super_IDeviceMemory.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00af0ed0;
  (this->m_Pages).
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Pages).
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Pages).
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_MemoryTypeIndex = 0xffffffff;
  pRVar1 = (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
           .m_pDevice;
  this_00 = (pRVar1->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  this_01 = (pRVar1->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (MemCI->NumResources == 0) {
    LogError<true,char[41],char[60]>
              (false,"DeviceMemoryVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0x34,(char (*) [41])"Device memory create info is not valid: ",
               (char (*) [60])"Vulkan requires at least one resource to choose memory type");
  }
  if (MemCI->ppCompatibleResources == (IDeviceObject **)0x0) {
    LogError<true,char[41],char[39]>
              (false,"DeviceMemoryVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0x37,(char (*) [41])"Device memory create info is not valid: ",
               (char (*) [39])"ppCompatibleResources must not be null");
  }
  local_84 = 0;
  if (MemCI->NumResources == 0) {
    memoryTypeBitsRequirement = 0xffffffff;
  }
  else {
    memoryTypeBitsRequirement = 0xffffffff;
    do {
      pIVar2 = MemCI->ppCompatibleResources[local_84];
      pTexture.m_pObject = (ITextureVk *)0x0;
      if (pIVar2 == (IDeviceObject *)0x0) {
        pBuffer.m_pObject = (IBufferVk *)0x0;
LAB_002b9f3a:
        FormatString<char[26]>(&msg,(char (*) [26])"unsupported resource type");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DeviceMemoryVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                   ,0x50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
LAB_002ba01c:
        if (pBuffer.m_pObject != (IBufferVk *)0x0) {
          (*((pBuffer.m_pObject)->super_IBuffer).super_IDeviceObject.super_IObject._vptr_IObject[2])
                    ();
        }
      }
      else {
        (**(pIVar2->super_IObject)._vptr_IObject)(pIVar2,IID_TextureVk,&pTexture);
        if (pTexture.m_pObject == (ITextureVk *)0x0) {
          pBuffer.m_pObject = (IBufferVk *)0x0;
          (**(pIVar2->super_IObject)._vptr_IObject)(pIVar2,IID_BufferVk,&pBuffer);
          if (pBuffer.m_pObject == (IBufferVk *)0x0) goto LAB_002b9f3a;
          this_02 = RefCntAutoPtr<Diligent::IBufferVk>::ConstPtr<Diligent::BufferVkImpl>(&pBuffer);
          if ((this_02->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc.Usage != USAGE_SPARSE) {
            LogError<true,char[41],char[23],unsigned_int,char[36]>
                      (false,"DeviceMemoryVkImpl",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                       ,0x4a,(char (*) [41])"Device memory create info is not valid: ",
                       (char (*) [23])"ppCompatibleResources[",&local_84,
                       (char (*) [36])"] must be created with USAGE_SPARSE");
          }
          vkBuffer = BufferVkImpl::GetVkBuffer(this_02);
          VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
                    ((VkMemoryRequirements *)&msg,this_01,vkBuffer);
          memoryTypeBitsRequirement =
               memoryTypeBitsRequirement & msg.field_2._M_allocated_capacity._0_4_;
          goto LAB_002ba01c;
        }
        pTVar4 = RefCntAutoPtr<Diligent::ITextureVk>::ConstPtr<Diligent::TextureVkImpl>(&pTexture);
        if ((pTVar4->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc.Usage != USAGE_SPARSE) {
          LogError<true,char[41],char[23],unsigned_int,char[36]>
                    (false,"DeviceMemoryVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                     ,0x42,(char (*) [41])"Device memory create info is not valid: ",
                     (char (*) [23])"ppCompatibleResources[",&local_84,
                     (char (*) [36])"] must be created with USAGE_SPARSE");
        }
        VulkanUtilities::VulkanLogicalDevice::GetImageMemoryRequirements
                  ((VkMemoryRequirements *)&msg,this_01,(pTVar4->m_VulkanImage).m_VkObject);
        memoryTypeBitsRequirement =
             memoryTypeBitsRequirement & msg.field_2._M_allocated_capacity._0_4_;
      }
      if (pTexture.m_pObject != (ITextureVk *)0x0) {
        (*((pTexture.m_pObject)->super_ITexture).super_IDeviceObject.super_IObject._vptr_IObject[2])
                  ();
      }
      local_84 = local_84 + 1;
    } while (local_84 < MemCI->NumResources);
    if (memoryTypeBitsRequirement == 0) {
      memoryTypeBitsRequirement = 0;
      LogError<true,char[41],char[54]>
                (false,"DeviceMemoryVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                 ,0x55,(char (*) [41])"Device memory create info is not valid: ",
                 (char (*) [54])"ppCompatibleResources contains incompatible resources");
    }
  }
  msg.field_2._8_4_ =
       VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                 (this_00,memoryTypeBitsRequirement,1);
  if (msg.field_2._8_4_ == 0xffffffff) {
    LogError<true,char[41],char[66]>
              (false,"DeviceMemoryVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0x5c,(char (*) [41])"Device memory create info is not valid: ",
               (char (*) [66])"Failed to find memory type for resources in ppCompatibleResources");
  }
  this->m_MemoryTypeIndex = msg.field_2._8_4_;
  msg._M_string_length = 0;
  msg._M_dataplus._M_p = (pointer)0x5;
  uVar5 = (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
          .m_Desc.PageSize;
  msg.field_2._12_4_ = 0;
  uVar3 = MemCI->InitialSize;
  __n = uVar3 / uVar5;
  msg.field_2._M_allocated_capacity = uVar5;
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
  ::reserve(&this->m_Pages,__n);
  if (uVar5 <= uVar3) {
    uVar5 = 0;
    do {
      VulkanUtilities::VulkanLogicalDevice::AllocateDeviceMemory
                ((DeviceMemoryWrapper *)&pTexture,this_01,(VkMemoryAllocateInfo *)&msg,
                 (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                 .m_Desc.super_DeviceObjectAttribs.Name);
      std::
      vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>>>
      ::
      emplace_back<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>>
                ((vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>>>
                  *)&this->m_Pages,(DeviceMemoryWrapper *)&pTexture);
      VulkanUtilities::
      VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
      ~VulkanObjectWrapper((DeviceMemoryWrapper *)&pTexture);
      uVar5 = uVar5 + 1;
    } while (uVar5 < __n);
  }
  return;
}

Assistant:

DeviceMemoryVkImpl::DeviceMemoryVkImpl(IReferenceCounters*           pRefCounters,
                                       RenderDeviceVkImpl*           pDeviceVk,
                                       const DeviceMemoryCreateInfo& MemCI) :
    TDeviceMemoryBase{pRefCounters, pDeviceVk, MemCI}
{
#define DEVMEM_CHECK_CREATE_INFO(...) \
    LOG_ERROR_AND_THROW("Device memory create info is not valid: ", __VA_ARGS__);

    const auto& PhysicalDevice = m_pDevice->GetPhysicalDevice();
    const auto& LogicalDevice  = m_pDevice->GetLogicalDevice();

    if (MemCI.NumResources == 0)
        DEVMEM_CHECK_CREATE_INFO("Vulkan requires at least one resource to choose memory type");

    if (MemCI.ppCompatibleResources == nullptr)
        DEVMEM_CHECK_CREATE_INFO("ppCompatibleResources must not be null");

    uint32_t MemoryTypeBits = ~0u;
    for (Uint32 i = 0; i < MemCI.NumResources; ++i)
    {
        auto* pResource = MemCI.ppCompatibleResources[i];

        if (RefCntAutoPtr<ITextureVk> pTexture{pResource, IID_TextureVk})
        {
            const auto* pTexVk = pTexture.ConstPtr<TextureVkImpl>();
            if (pTexVk->GetDesc().Usage != USAGE_SPARSE)
                DEVMEM_CHECK_CREATE_INFO("ppCompatibleResources[", i, "] must be created with USAGE_SPARSE");

            MemoryTypeBits &= LogicalDevice.GetImageMemoryRequirements(pTexVk->GetVkImage()).memoryTypeBits;
        }
        else if (RefCntAutoPtr<IBufferVk> pBuffer{pResource, IID_BufferVk})
        {
            const auto* pBuffVk = pBuffer.ConstPtr<BufferVkImpl>();
            if (pBuffVk->GetDesc().Usage != USAGE_SPARSE)
                DEVMEM_CHECK_CREATE_INFO("ppCompatibleResources[", i, "] must be created with USAGE_SPARSE");

            MemoryTypeBits &= LogicalDevice.GetBufferMemoryRequirements(pBuffVk->GetVkBuffer()).memoryTypeBits;
        }
        else
        {
            UNEXPECTED("unsupported resource type");
        }
    }

    if (MemoryTypeBits == 0)
        DEVMEM_CHECK_CREATE_INFO("ppCompatibleResources contains incompatible resources");

    static constexpr auto InvalidMemoryTypeIndex = VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex;

    uint32_t MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    if (MemoryTypeIndex == InvalidMemoryTypeIndex)
        DEVMEM_CHECK_CREATE_INFO("Failed to find memory type for resources in ppCompatibleResources");

    m_MemoryTypeIndex = MemoryTypeIndex;

    VkMemoryAllocateInfo MemAlloc{};
    MemAlloc.pNext           = nullptr;
    MemAlloc.sType           = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
    MemAlloc.allocationSize  = m_Desc.PageSize;
    MemAlloc.memoryTypeIndex = m_MemoryTypeIndex;

    const auto PageCount = StaticCast<size_t>(MemCI.InitialSize / m_Desc.PageSize);
    m_Pages.reserve(PageCount);

    for (size_t i = 0; i < PageCount; ++i)
        m_Pages.emplace_back(LogicalDevice.AllocateDeviceMemory(MemAlloc, m_Desc.Name)); // throw on error
}